

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O0

Result * CoreML::Result::typeMismatchError
                   (Result *__return_storage_ptr__,FeatureType *expected,FeatureType *actual,
                   string *parameterName)

{
  ostream *poVar1;
  string local_228 [32];
  string local_208;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [383];
  byte local_29;
  string *local_28;
  string *parameterName_local;
  FeatureType *actual_local;
  FeatureType *expected_local;
  Result *out;
  
  local_29 = 0;
  local_28 = parameterName;
  parameterName_local = (string *)actual;
  actual_local = expected;
  expected_local = (FeatureType *)__return_storage_ptr__;
  Result(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"Type mismatch for \"");
  poVar1 = std::operator<<(local_1a8,(string *)local_28);
  std::operator<<(poVar1,"\". Expected ");
  FeatureType::toString_abi_cxx11_(&local_1e8,actual_local);
  poVar1 = std::operator<<(local_1a8,(string *)&local_1e8);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::operator<<(local_1a8,"found ");
  FeatureType::toString_abi_cxx11_(&local_208,(FeatureType *)parameterName_local);
  poVar1 = std::operator<<(local_1a8,(string *)&local_208);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,local_228);
  std::__cxx11::string::~string(local_228);
  __return_storage_ptr__->m_type = TYPE_MISMATCH;
  local_29 = 1;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  if ((local_29 & 1) == 0) {
    ~Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result Result::typeMismatchError(
      const FeatureType& expected,
      const FeatureType& actual,
      const std::string& parameterName) {

    Result out;
    std::stringstream ss;
    ss << "Type mismatch for \"";
    ss << parameterName <<"\". Expected ";
    ss << expected.toString() << ", ";
    ss << "found ";
    ss << actual.toString() << ".";
    out.m_message = ss.str();
    out.m_type = ResultType::TYPE_MISMATCH;
    return out;
  }